

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O1

int Nwk_ManPiNum(Nwk_Man_t *pNtk)

{
  uint uVar1;
  Tim_Man_t *p;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  
  pVVar3 = pNtk->vCis;
  if (pVVar3->nSize < 1) {
    iVar5 = 0;
  }
  else {
    lVar6 = 0;
    iVar5 = 0;
    do {
      uVar1 = *(uint *)((long)pVVar3->pArray[lVar6] + 0x20);
      uVar4 = 0;
      if ((uVar1 & 7) == 1) {
        p = *(Tim_Man_t **)(*pVVar3->pArray[lVar6] + 0x48);
        if (p == (Tim_Man_t *)0x0) {
          uVar4 = 1;
        }
        else {
          iVar2 = Tim_ManBoxForCi(p,uVar1 >> 7);
          uVar4 = (uint)(iVar2 == -1);
        }
      }
      iVar5 = iVar5 + uVar4;
      lVar6 = lVar6 + 1;
      pVVar3 = pNtk->vCis;
    } while (lVar6 < pVVar3->nSize);
  }
  return iVar5;
}

Assistant:

int Nwk_ManPiNum( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pNode;
    int i, Counter = 0;
    Nwk_ManForEachCi( pNtk, pNode, i )
        Counter += Nwk_ObjIsPi( pNode );
    return Counter;
}